

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMemoryStressTests.cpp
# Opt level: O0

void __thiscall deqp::egl::anon_unknown_0::MemoryAllocator::allocateContext(MemoryAllocator *this)

{
  deUint32 dVar1;
  deBool dVar2;
  GLenum GVar3;
  size_type sVar4;
  iterator first;
  iterator last;
  void *pvVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  Error *error;
  float alpha;
  float blue;
  float green;
  float red;
  EGLSurface surface;
  EGLContext context;
  EGLint attribList [3];
  Library *egl;
  bad_alloc *anon_var_0;
  MemoryAllocator *this_local;
  
  sVar4 = std::vector<void_*,_std::allocator<void_*>_>::size(&this->m_contexts);
  std::vector<void_*,_std::allocator<void_*>_>::reserve(&this->m_contexts,sVar4 + 1);
  attribList._4_8_ = EglTestContext::getLibrary(this->m_eglTestCtx);
  stack0xffffffffffffffc4 = 0x200003098;
  attribList[0] = 0x3038;
  do {
    (*(code *)**(undefined8 **)attribList._4_8_)(attribList._4_8_,0x30a0);
    dVar1 = (**(code **)(*(long *)attribList._4_8_ + 0xf8))();
    eglu::checkError(dVar1,"bindAPI(EGL_OPENGL_ES_API)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMemoryStressTests.cpp"
                     ,0x110);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  surface = (EGLSurface)
            (**(code **)(*(long *)attribList._4_8_ + 0x30))
                      (attribList._4_8_,this->m_display,this->m_config,0,(long)&context + 4);
  dVar1 = (**(code **)(*(long *)attribList._4_8_ + 0xf8))();
  eglu::checkError(dVar1,"eglCreateContext",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMemoryStressTests.cpp"
                   ,0x112);
  std::vector<void_*,_std::allocator<void_*>_>::push_back(&this->m_contexts,&surface);
  if (((this->m_use & 1U) != 0) &&
     (sVar4 = std::vector<void_*,_std::allocator<void_*>_>::size(&this->m_pbuffers), sVar4 != 0)) {
    first = std::vector<void_*,_std::allocator<void_*>_>::begin(&this->m_pbuffers);
    last = std::vector<void_*,_std::allocator<void_*>_>::end(&this->m_pbuffers);
    pvVar5 = de::Random::
             choose<void*,__gnu_cxx::__normal_iterator<void**,std::vector<void*,std::allocator<void*>>>>
                       (&this->m_rnd,
                        (__normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>)
                        first._M_current,
                        (__normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>)
                        last._M_current);
    fVar6 = de::Random::getFloat(&this->m_rnd);
    fVar7 = de::Random::getFloat(&this->m_rnd);
    fVar8 = de::Random::getFloat(&this->m_rnd);
    fVar9 = de::Random::getFloat(&this->m_rnd);
    do {
      (**(code **)(*(long *)attribList._4_8_ + 0x138))
                (attribList._4_8_,this->m_display,pvVar5,pvVar5,surface);
      dVar1 = (**(code **)(*(long *)attribList._4_8_ + 0xf8))();
      eglu::checkError(dVar1,"makeCurrent(m_display, surface, surface, context)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMemoryStressTests.cpp"
                       ,0x120);
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    (*(this->m_gl).clearColor)(fVar6,fVar7,fVar8,fVar9);
    GVar3 = (*(this->m_gl).getError)();
    glu::checkError(GVar3,"glClearColor()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMemoryStressTests.cpp"
                    ,0x123);
    (*(this->m_gl).clear)(0x4000);
    GVar3 = (*(this->m_gl).getError)();
    glu::checkError(GVar3,"glClear()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMemoryStressTests.cpp"
                    ,0x126);
    do {
      (**(code **)(*(long *)attribList._4_8_ + 0x138))(attribList._4_8_,this->m_display,0,0);
      dVar1 = (**(code **)(*(long *)attribList._4_8_ + 0xf8))();
      eglu::checkError(dVar1,
                       "makeCurrent(m_display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMemoryStressTests.cpp"
                       ,0x128);
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
  }
  return;
}

Assistant:

void MemoryAllocator::allocateContext (void)
{
	// Reserve space for new allocations
	try
	{
		m_contexts.reserve(m_contexts.size() + 1);
	}
	catch (const std::bad_alloc&)
	{
		m_errorString	= "std::bad_alloc when allocating more space for testcase. Out of host memory.";
		m_failed		= true;
		return;
	}

	// Allocate context
	try
	{
		const Library&	egl				= m_eglTestCtx.getLibrary();
		const EGLint	attribList[]	=
		{
			EGL_CONTEXT_CLIENT_VERSION, 2,
			EGL_NONE
		};

		EGLU_CHECK_CALL(egl, bindAPI(EGL_OPENGL_ES_API));
		EGLContext context = egl.createContext(m_display, m_config, EGL_NO_CONTEXT, attribList);
		EGLU_CHECK_MSG(egl, "eglCreateContext");

		DE_ASSERT(context != EGL_NO_CONTEXT);

		m_contexts.push_back(context);

		if (m_use && m_pbuffers.size() > 0)
		{
			EGLSurface				surface		= m_rnd.choose<EGLSurface>(m_pbuffers.begin(), m_pbuffers.end());
			const float				red			= m_rnd.getFloat();
			const float				green		= m_rnd.getFloat();
			const float				blue		= m_rnd.getFloat();
			const float				alpha		= m_rnd.getFloat();

			EGLU_CHECK_CALL(egl, makeCurrent(m_display, surface, surface, context));

			m_gl.clearColor(red, green, blue, alpha);
			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glClearColor()");

			m_gl.clear(GL_COLOR_BUFFER_BIT);
			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glClear()");

			EGLU_CHECK_CALL(egl, makeCurrent(m_display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT));
		}
	}
	catch (const eglu::Error& error)
	{
		if (error.getError() == EGL_BAD_ALLOC)
		{
			m_errorString	= "eglCreateContext returned EGL_BAD_ALLOC";
			m_failed		= true;
			return;
		}
		else
			throw;
	}
}